

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleRegressor::InternalSwap
          (TreeEnsembleRegressor *this,TreeEnsembleRegressor *other)

{
  TreeEnsembleRegressor *other_local;
  TreeEnsembleRegressor *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::memswap<12>
            ((char *)&this->treeensemble_,(char *)&other->treeensemble_);
  return;
}

Assistant:

void TreeEnsembleRegressor::InternalSwap(TreeEnsembleRegressor* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(TreeEnsembleRegressor, postevaluationtransform_)
      + sizeof(TreeEnsembleRegressor::postevaluationtransform_)
      - PROTOBUF_FIELD_OFFSET(TreeEnsembleRegressor, treeensemble_)>(
          reinterpret_cast<char*>(&treeensemble_),
          reinterpret_cast<char*>(&other->treeensemble_));
}